

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUpdateLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *eps,
                 number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *vec,int *nonz,int n)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  int iVar2;
  int iVar3;
  fpclass_type fVar4;
  pointer pnVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int32_t iVar9;
  bool bVar10;
  fpclass_type fVar11;
  int32_t iVar12;
  int iVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  uint *puVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  uint *puVar24;
  int iVar25;
  bool bVar26;
  byte bVar27;
  undefined8 uVar28;
  type t;
  int local_284;
  cpp_dec_float<200U,_int,_void> local_238;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [13];
  undefined3 uStack_14b;
  int iStack_148;
  bool bStack_144;
  undefined8 local_140;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar27 = 0;
  iVar2 = (this->l).firstUpdate;
  iVar13 = (this->l).firstUnused;
  lVar16 = (long)iVar13;
  local_284 = n;
  if (iVar2 < iVar13) {
    pnVar5 = (this->l).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar6 = (this->l).idx;
    piVar7 = (this->l).row;
    piVar8 = (this->l).start;
    do {
      iVar13 = piVar8[lVar16 + -1];
      iVar3 = piVar7[lVar16 + -1];
      pnVar1 = vec + iVar3;
      pnVar21 = pnVar1;
      pcVar22 = &local_238;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pcVar22->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
        pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar21 + ((ulong)bVar27 * -2 + 1) * 4);
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      puVar20 = vec[iVar3].m_backend.data._M_elems + 1;
      local_238.exp = puVar20[0x1b];
      local_238.neg = *(bool *)(puVar20 + 0x1c);
      local_238.fpclass = puVar20[0x1d];
      local_238.prec_elem = puVar20[0x1e];
      puVar24 = local_130.data._M_elems + 1;
      for (lVar15 = 0x1b; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar24 = *puVar20;
        puVar20 = puVar20 + (ulong)bVar27 * -2 + 1;
        puVar24 = puVar24 + (ulong)bVar27 * -2 + 1;
      }
      local_130.data._M_elems[0] = local_238.data._M_elems[0];
      local_130.exp = local_238.exp;
      local_130.neg =
           (bool)((local_238.data._M_elems[0] != 0 || local_238.fpclass != cpp_dec_float_finite) ^
                 local_238.neg);
      local_130.fpclass = local_238.fpclass;
      local_130.prec_elem = local_238.prec_elem;
      iVar25 = piVar8[lVar16];
      if (iVar3 < iVar25) {
        piVar17 = piVar6 + iVar13;
        pcVar22 = &pnVar5[iVar13].m_backend;
        do {
          pcVar14 = &vec[*piVar17].m_backend;
          local_140._0_4_ = cpp_dec_float_finite;
          local_140._4_4_ = 0x1c;
          local_1b8 = (undefined1  [16])0x0;
          local_1a8 = (undefined1  [16])0x0;
          local_198 = (undefined1  [16])0x0;
          local_188 = (undefined1  [16])0x0;
          local_178 = (undefined1  [16])0x0;
          local_168 = (undefined1  [16])0x0;
          local_158 = SUB1613((undefined1  [16])0x0,0);
          uStack_14b = 0;
          iStack_148 = 0;
          bStack_144 = false;
          pcVar19 = pcVar14;
          if ((pcVar22 != (cpp_dec_float<200U,_int,_void> *)local_1b8) &&
             (pcVar19 = pcVar22, (cpp_dec_float<200U,_int,_void> *)local_1b8 != pcVar14)) {
            pcVar18 = pcVar14;
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar27 * -8 + 4);
            }
            iStack_148 = pcVar14->exp;
            bStack_144 = pcVar14->neg;
            local_140._0_4_ = pcVar14->fpclass;
            local_140._4_4_ = pcVar14->prec_elem;
          }
          piVar17 = piVar17 + 1;
          pcVar22 = pcVar22 + 1;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_1b8,pcVar19);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_130,(cpp_dec_float<200U,_int,_void> *)local_1b8);
          iVar25 = iVar25 + -1;
        } while (iVar3 < iVar25);
      }
      if (local_238.fpclass == cpp_dec_float_NaN) {
LAB_0053df38:
        iVar12 = local_130.prec_elem;
        fVar11 = local_130.fpclass;
        bVar10 = local_130.neg;
        iVar13 = local_130.exp;
        local_238.data._M_elems[0] = local_130.data._M_elems[0];
        puVar20 = local_130.data._M_elems + 1;
        puVar24 = local_238.data._M_elems + 1;
        for (lVar15 = 0x1b; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar24 = *puVar20;
          puVar20 = puVar20 + (ulong)bVar27 * -2 + 1;
          puVar24 = puVar24 + (ulong)bVar27 * -2 + 1;
        }
        local_238.neg =
             (bool)((fVar11 != cpp_dec_float_finite || local_238.data._M_elems[0] != 0) ^ bVar10);
        local_238.exp = iVar13;
        local_238.fpclass = fVar11;
        local_238.prec_elem = iVar12;
        if (fVar11 == cpp_dec_float_NaN) {
          uVar28._4_4_ = iVar12;
          uVar28._0_4_ = cpp_dec_float_NaN;
LAB_0053dfc7:
          pcVar22 = &local_238;
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar19->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar22 + ((ulong)bVar27 * -2 + 1) * 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar27 * -8 + 4);
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)local_1b8,0,(type *)0x0);
          iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_238,(cpp_dec_float<200U,_int,_void> *)local_1b8);
          if (iVar13 != 0) {
            uVar28._4_4_ = local_238.prec_elem;
            uVar28._0_4_ = local_238.fpclass;
            goto LAB_0053dfc7;
          }
          local_140._0_4_ = cpp_dec_float_finite;
          local_140._4_4_ = 0x1c;
          local_1b8 = (undefined1  [16])0x0;
          local_1a8 = (undefined1  [16])0x0;
          local_198 = (undefined1  [16])0x0;
          local_188 = (undefined1  [16])0x0;
          local_178 = (undefined1  [16])0x0;
          local_168 = (undefined1  [16])0x0;
          local_158 = SUB1613((undefined1  [16])0x0,0);
          uStack_14b = 0;
          iStack_148 = 0;
          bStack_144 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_1b8,1e-100);
          local_238.exp = iStack_148;
          local_238.neg = bStack_144;
          uVar28 = local_140;
        }
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
        pnVar21 = pnVar1;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pnVar21->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar27 * -8 + 4);
          pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar21 + ((ulong)bVar27 * -2 + 1) * 4);
        }
        (pnVar1->m_backend).exp = local_238.exp;
        (pnVar1->m_backend).neg = local_238.neg;
        (pnVar1->m_backend).fpclass = (fpclass_type)uVar28;
        (pnVar1->m_backend).prec_elem = SUB84(uVar28,4);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_1b8,0,(type *)0x0);
        iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_238,(cpp_dec_float<200U,_int,_void> *)local_1b8);
        local_238.prec_elem = local_130.prec_elem;
        local_238.fpclass = local_130.fpclass;
        bVar10 = local_130.neg;
        local_238.exp = local_130.exp;
        local_238.data._M_elems[0] = local_130.data._M_elems[0];
        if (iVar13 != 0) goto LAB_0053df38;
        puVar20 = local_130.data._M_elems + 1;
        puVar24 = local_238.data._M_elems + 1;
        for (lVar15 = 0x1b; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar24 = *puVar20;
          puVar20 = puVar20 + (ulong)bVar27 * -2 + 1;
          puVar24 = puVar24 + (ulong)bVar27 * -2 + 1;
        }
        bVar26 = local_238.fpclass != cpp_dec_float_finite || local_238.data._M_elems[0] != 0;
        local_238.neg = (bool)(bVar10 ^ bVar26);
        pcVar22 = &local_238;
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar19->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar27 * -8 + 4);
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar27 * -8 + 4);
        }
        pnVar21 = eps;
        pcVar22 = &local_b0;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar22->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
          pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar21 + ((ulong)bVar27 * -2 + 1) * 4);
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar27 * -2 + 1) * 4)
          ;
        }
        local_b0.exp = (eps->m_backend).exp;
        local_b0.neg = (eps->m_backend).neg;
        fVar4 = (eps->m_backend).fpclass;
        iVar9 = (eps->m_backend).prec_elem;
        local_b0.fpclass = fVar4;
        local_b0.prec_elem = iVar9;
        iStack_148 = local_238.exp;
        bStack_144 = local_238.neg;
        local_140._4_4_ = local_238.prec_elem;
        local_140._0_4_ = local_238.fpclass;
        if ((bVar10 != bVar26) &&
           (local_1b8._0_4_ != 0 || local_238.fpclass != cpp_dec_float_finite)) {
          bStack_144 = (bool)(local_238.neg ^ 1);
        }
        if ((fVar4 != cpp_dec_float_NaN && local_238.fpclass != cpp_dec_float_NaN) &&
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_1b8,&local_b0), 0 < iVar13))
        {
          lVar15 = (long)local_284;
          local_284 = local_284 + 1;
          nonz[lVar15] = iVar3;
          pcVar22 = &local_238;
          pnVar21 = pnVar1;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pnVar21->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar22 + ((ulong)bVar27 * -2 + 1) * 4);
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          (pnVar1->m_backend).exp = local_238.exp;
          (pnVar1->m_backend).neg = local_238.neg;
          (pnVar1->m_backend).fpclass = local_238.fpclass;
          (pnVar1->m_backend).prec_elem = local_238.prec_elem;
        }
      }
      lVar16 = lVar16 + -1;
    } while (iVar2 < lVar16);
  }
  return local_284;
}

Assistant:

int CLUFactor<R>::solveUpdateLeft(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates! */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];

      k = lrow[i];

      y = vec[k];
      StableSum<R> tmp(-y);

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         tmp += vec[*idx++] * (*val++);
      }

      if(y == 0)
      {
         y = -R(tmp);

         if(isNotZero(y, eps))
         {
            nonz[n++] = k;
            vec[k] = y;
         }
      }
      else
      {
         y = -R(tmp);
         vec[k] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
      }
   }

   return n;
}